

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::anon_unknown_0::atot<double>(anon_unknown_0 *this,char *s,Parser *parser,double *val)

{
  double dVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar2 = StringToFloatImpl<double>(val,s);
  dVar1 = *val;
  if (bVar2) {
    *val = (double)(~-(ulong)NAN(dVar1) & (ulong)dVar1 | (ulong)ABS(dVar1) & -(ulong)NAN(dVar1));
    *(undefined2 *)this = 0;
  }
  else {
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,s,&local_e1);
      std::operator+(&local_80,"invalid number: \"",&local_40);
      std::operator+(&local_e0,&local_80,"\"");
      std::operator+(&local_c0,&local_e0,", constant does not fit ");
      TypeToIntervalString<double>();
      std::operator+(&local_a0,&local_c0,&local_60);
      Parser::Error((Parser *)this,(string *)parser);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_80);
      this_00 = &local_40;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,s,(allocator<char> *)&local_80);
      std::operator+(&local_c0,"invalid number: \"",&local_e0);
      std::operator+(&local_a0,&local_c0,"\"");
      Parser::Error((Parser *)this,(string *)parser);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      this_00 = &local_e0;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return SUB82(this,0);
}

Assistant:

static CheckedError atot(const char *s, Parser &parser, T *val) {
  auto done = atot_scalar(s, val, bool_constant<is_floating_point<T>::value>());
  if (done) return NoError();
  if (0 == *val)
    return parser.Error("invalid number: \"" + std::string(s) + "\"");
  else
    return parser.Error("invalid number: \"" + std::string(s) + "\"" +
                        ", constant does not fit " + TypeToIntervalString<T>());
}